

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

void __thiscall
QTextStreamPrivate::putString(QTextStreamPrivate *this,QUtf8StringView data,bool number)

{
  QString *this_00;
  undefined7 in_register_00000009;
  storage_type *psVar1;
  QString *pQVar2;
  char *__s;
  long in_FS_OFFSET;
  bool bVar3;
  QByteArrayView ba;
  QString local_40;
  long local_28;
  
  pQVar2 = (QString *)data.m_size;
  __s = data.m_data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QString *)0x0;
  if (0 < (long)pQVar2) {
    this_00 = pQVar2;
  }
  bVar3 = __s == (char *)0x0;
  if (bVar3) {
    this_00 = (QString *)0x0;
  }
  psVar1 = (storage_type *)CONCAT71(in_register_00000009,bVar3 || -1 < (long)pQVar2);
  if (!bVar3 && -1 >= (long)pQVar2) {
    this_00 = (QString *)strlen(__s);
  }
  ba.m_data = psVar1;
  ba.m_size = (qsizetype)__s;
  QString::fromUtf8(&local_40,this_00,ba);
  putString(this,(QChar *)local_40.d.ptr,local_40.d.size,number);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putString(QUtf8StringView data, bool number)
{
    putString(data.toString(), number);
}